

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_table_info.cpp
# Opt level: O1

void duckdb::PragmaTableInfo::RegisterFunction(BuiltinFunctions *set)

{
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_411;
  LogicalType local_410;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3e0;
  string local_3c8;
  string local_3a8;
  TableFunction local_388;
  TableFunction local_1d0;
  
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"pragma_table_info","");
  LogicalType::LogicalType(&local_410,VARCHAR);
  __l._M_len = 1;
  __l._M_array = &local_410;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3e0,__l,&local_411);
  TableFunction::TableFunction
            (&local_1d0,&local_3a8,(vector<duckdb::LogicalType,_true> *)&local_3e0,
             PragmaTableInfoFunction,PragmaTableInfoBind<true>,PragmaTableInfoInit,
             (table_function_init_local_t)0x0);
  BuiltinFunctions::AddFunction(set,&local_1d0);
  local_1d0.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_01993668;
  if (local_1d0.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d0.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_1d0.super_SimpleNamedParameterFunction);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3e0);
  LogicalType::~LogicalType(&local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"pragma_show","");
  LogicalType::LogicalType(&local_410,VARCHAR);
  __l_00._M_len = 1;
  __l_00._M_array = &local_410;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3f8,__l_00,&local_411);
  TableFunction::TableFunction
            (&local_388,&local_3c8,(vector<duckdb::LogicalType,_true> *)&local_3f8,
             PragmaTableInfoFunction,PragmaTableInfoBind<false>,PragmaTableInfoInit,
             (table_function_init_local_t)0x0);
  BuiltinFunctions::AddFunction(set,&local_388);
  local_388.super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__TableFunction_01993668;
  if (local_388.function_info.internal.
      super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.function_info.internal.
               super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            (&local_388.super_SimpleNamedParameterFunction);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3f8);
  LogicalType::~LogicalType(&local_410);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PragmaTableInfo::RegisterFunction(BuiltinFunctions &set) {
	set.AddFunction(TableFunction("pragma_table_info", {LogicalType::VARCHAR}, PragmaTableInfoFunction,
	                              PragmaTableInfoBind<true>, PragmaTableInfoInit));
	set.AddFunction(TableFunction("pragma_show", {LogicalType::VARCHAR}, PragmaTableInfoFunction,
	                              PragmaTableInfoBind<false>, PragmaTableInfoInit));
}